

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

void CVmPack::pack(int arg_index,int argc,CVmDataSource *dst)

{
  int iVar1;
  char *pcVar2;
  int __c;
  int in_EDI;
  StackArgs args;
  CVmPackGroup root;
  CVmPackPos p;
  size_t fmtlen;
  char *fmt;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  CVmPackArgs in_stack_ffffffffffffff60;
  CVmStack *in_stack_ffffffffffffff68;
  CVmPackGroup *in_stack_ffffffffffffff70;
  CVmPackPos local_38;
  size_t local_20;
  char *local_18;
  
  CVmStack::get((long)in_EDI);
  local_18 = vm_val_t::get_as_string
                       ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (local_18 == (char *)0x0) {
    err_throw(0);
  }
  local_20 = vmb_get_len((char *)0x3254bc);
  local_18 = local_18 + 2;
  CVmPackPos::CVmPackPos
            ((CVmPackPos *)in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68,
             (size_t)in_stack_ffffffffffffff60._vptr_CVmPackArgs);
  CVmPackGroup::CVmPackGroup
            (in_stack_ffffffffffffff70,(CVmPackPos *)in_stack_ffffffffffffff68,
             (CVmDataSource *)in_stack_ffffffffffffff60._vptr_CVmPackArgs);
  StackArgs::StackArgs
            ((StackArgs *)in_stack_ffffffffffffff60._vptr_CVmPackArgs,in_stack_ffffffffffffff5c,
             in_stack_ffffffffffffff58);
  pcVar2 = &stack0xffffffffffffff60;
  pack_group((CVmPackPos *)root._64_8_,(CVmPackArgs *)root.stream_ofs,(CVmPackGroup *)root.ds,
             root.start._20_4_);
  iVar1 = CVmPackPos::more((CVmPackPos *)in_stack_ffffffffffffff60._vptr_CVmPackArgs);
  if (iVar1 != 0) {
    pcVar2 = CVmPackPos::index(&local_38,pcVar2,__c);
    err_throw_a(0x6b,1,0,(ulong)pcVar2 & 0xffffffff);
  }
  iVar1 = StackArgs::more((StackArgs *)&stack0xffffffffffffff60);
  if (iVar1 != 0) {
    err_throw_a(0x6d,1,0,(ulong)((int)local_20 + 1));
  }
  return;
}

Assistant:

void CVmPack::pack(VMG_ int arg_index, int argc, CVmDataSource *dst)
{
    /* the first argument is the format string - retrieve it */
    const char *fmt = G_stk->get(arg_index)->get_as_string(vmg0_);
    if (fmt == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the format string length and buffer pointer */
    size_t fmtlen = vmb_get_len(fmt);
    fmt += VMB_LEN;

    /* pack the root group */
    CVmPackPos p(fmt, fmtlen);
    CVmPackGroup root(&p, dst);
    StackArgs args(vmg_ arg_index + 1, argc - 1);
    pack_group(vmg_ &p, &args, &root, FALSE);

    /* make sure we exhausted the string */
    if (p.more())
        err_throw_a(VMERR_PACK_PARSE, 1, ERR_TYPE_INT, p.index());

    /* 
     *   if we didn't consume all of the arguments, it means that the format
     *   string didn't have enough entries for the supplied arguments - flag
     *   an error 
     */
    if (args.more())
        err_throw_a(VMERR_PACK_ARGC_MISMATCH, 1, ERR_TYPE_INT, (int)fmtlen+1);
}